

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-test.cpp
# Opt level: O2

void updtMem2(FOCC_CTA *foccOta,int mTid)

{
  long *plVar1;
  FILE *__stream;
  FOCC_CTA *this;
  char cVar2;
  int iVar3;
  long lVar4;
  tm *ptVar5;
  pthread_t pVar6;
  uint uVar7;
  ulong uVar8;
  result_type_conflict rVar9;
  int locVal;
  uint local_94;
  time_t exitTime;
  int local_88;
  uint local_84;
  int local_80;
  int local_7c;
  FOCC_CTA *local_78;
  long local_70;
  long local_68;
  time_t enterTime;
  char buf [40];
  
  local_70 = (long)mTid;
  local_78 = foccOta;
  for (local_88 = 0; local_88 < glb::numTrans; local_88 = local_88 + 1) {
    uVar7 = 0;
    local_68 = std::chrono::_V2::system_clock::now();
    do {
      local_84 = uVar7;
      local_94 = FOCC_CTA::begin_trans(foccOta);
      local_80 = rand();
      local_80 = local_80 % glb::M;
      iVar3 = 0;
      while (foccOta = local_78, uVar7 = local_94, iVar3 <= local_80) {
        local_7c = iVar3;
        iVar3 = rand();
        uVar8 = (long)iVar3 % (long)glb::M;
        iVar3 = rand();
        this = local_78;
        uVar7 = local_94;
        iVar3 = iVar3 % glb::constVal;
        FOCC_CTA::read(local_78,local_94,(void *)(uVar8 & 0xffffffff),(size_t)&locVal);
        lVar4 = std::chrono::_V2::system_clock::now();
        exitTime = lVar4 / 1000000000;
        ptVar5 = localtime(&exitTime);
        strftime(buf,0x28,"%H:%M:%S",ptVar5);
        __stream = glb::log_file;
        pVar6 = pthread_self();
        fprintf(__stream,"Thread ID %ld Transaction %d reads from %d a value %d at time %s\n",pVar6,
                (ulong)uVar7,uVar8 & 0xffffffff,(ulong)(uint)locVal,buf);
        locVal = iVar3 + locVal;
        FOCC_CTA::write(this,uVar7,(void *)(uVar8 & 0xffffffff),(ulong)(uint)locVal);
        lVar4 = std::chrono::_V2::system_clock::now();
        enterTime = lVar4 / 1000000000;
        ptVar5 = localtime(&enterTime);
        strftime(buf,0x28,"%H:%M:%S",ptVar5);
        fprintf(glb::log_file,"Thread ID %ld Transaction %d writes to %d a value %d at time %s\n",
                pVar6,(ulong)uVar7,uVar8 & 0xffffffff,(ulong)(uint)locVal,buf);
        rVar9 = std::exponential_distribution<double>::operator()
                          ((exponential_distribution<double> *)&glb::dist,
                           (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                           &glb::generator);
        usleep((__useconds_t)(long)(rVar9 * 1000.0));
        iVar3 = local_7c + 1;
      }
      cVar2 = FOCC_CTA::tryC(local_78,local_94);
      lVar4 = std::chrono::_V2::system_clock::now();
      exitTime = lVar4 / 1000000000;
      ptVar5 = localtime(&exitTime);
      strftime(buf,0x28,"%H:%M:%S",ptVar5);
      fprintf(glb::log_file,"Transaction %d tryCommits with result %c at time %s\n\n",(ulong)uVar7,
              (ulong)(uint)(int)cVar2,buf);
      uVar7 = (cVar2 == 'a') + local_84;
    } while (cVar2 != 'c');
    uVar8 = (ulong)local_84;
    lVar4 = std::chrono::_V2::system_clock::now();
    plVar1 = (long *)(glb::total_delay + local_70 * 8);
    *plVar1 = *plVar1 + (lVar4 - local_68) / 1000000;
    plVar1 = (long *)(glb::total_aborts + local_70 * 8);
    *plVar1 = *plVar1 + uVar8;
  }
  return;
}

Assistant:

void updtMem2(FOCC_CTA* foccOta, int mTid){
    int abortCnt = 0;
    char status = glb::TRANS_ABORT;

    char buf[40];
    // each thread invokes numTrans Transactions!
    for(int curTrans=0; curTrans<glb::numTrans; curTrans++){
        abortCnt = 0;
        auto start = high_resolution_clock::now();
        do {
            int id = foccOta->begin_trans();
            int nItr = rand()%glb::M + 1;

            int locVal;

            for(int i=0; i<nItr; i++){
                // rnadom index to be updated.
                int randInd = rand()%glb::M;
                int randVal = rand()%glb::constVal;

                foccOta->read(id, randInd, &locVal);

                auto _reqTime = std::chrono::system_clock::now();
                time_t reqTime = std::chrono::system_clock::to_time_t(_reqTime);
                struct tm* tinfo= localtime(&reqTime);
                strftime (buf, sizeof (buf), "%H:%M:%S", tinfo);
                fprintf(glb::log_file,"Thread ID %ld Transaction %d reads from %d a value %d at time %s\n", std::this_thread::get_id()
                        , id, randInd, locVal, buf);

                locVal+=randVal;

                foccOta->write(id, randInd, locVal);

                auto _enterTime = std::chrono::system_clock::now(); //the timepoint
                auto enterTime = std::chrono::system_clock::to_time_t(_enterTime);
                tinfo= localtime(&enterTime);
                strftime (buf, sizeof (buf), "%H:%M:%S", tinfo);

                fprintf(glb::log_file,"Thread ID %ld Transaction %d writes to %d a value %d at time %s\n", std::this_thread::get_id()
                        , id, randInd, locVal, buf);

                usleep(1000*glb::dist(glb::generator));
            }

            status = foccOta->tryC(id);

            auto _exitTime = std::chrono::system_clock::now(); //the timepoint
            auto exitTime = std::chrono::system_clock::to_time_t(_exitTime);
            struct tm* tinfo= localtime(&exitTime);
            strftime (buf, sizeof (buf), "%H:%M:%S", tinfo);
            fprintf(glb::log_file,"Transaction %d tryCommits with result %c at time %s\n\n", id, status, buf);
            //fprintf(stdout,"Transaction %d tryCommits with result %c\n", id, status);

            if(status == glb::TRANS_ABORT) {abortCnt++;}

        } while(status!=glb::TRANS_COMMIT);

        auto time_to_commit = duration_cast<milliseconds>(high_resolution_clock::now() - start);
        glb::total_delay[mTid]+=time_to_commit.count();
        glb::total_aborts[mTid]+=abortCnt;
    } // for
}